

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

RecyclableObject *
Js::JavascriptOperators::GetIterator
          (RecyclableObject *instance,ScriptContext *scriptContext,bool optional)

{
  code *pcVar1;
  anon_class_24_3_49f86fea implicitCall;
  bool bVar2;
  BOOL BVar3;
  RecyclableObject *function_00;
  undefined4 *puVar4;
  ThreadContext *this;
  Var instance_00;
  Var iterator;
  RecyclableObject *function;
  bool optional_local;
  ScriptContext *scriptContext_local;
  RecyclableObject *instance_local;
  
  function_00 = GetIteratorFunction(instance,scriptContext,optional);
  if (function_00 == (RecyclableObject *)0x0) {
    if (!optional) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x2b7e,"(optional)","optional");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    instance_local = (RecyclableObject *)0x0;
  }
  else {
    this = ScriptContext::GetThreadContext(scriptContext);
    implicitCall.function = function_00;
    implicitCall.scriptContext = scriptContext;
    implicitCall.instance = instance;
    instance_00 = ThreadContext::
                  ExecuteImplicitCall<Js::JavascriptOperators::GetIterator(Js::RecyclableObject*,Js::ScriptContext*,bool)::__0>
                            (this,function_00,ImplicitCall_Accessor,implicitCall);
    BVar3 = IsObject(instance_00);
    if (BVar3 == 0) {
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec71,(PCWSTR)0x0);
    }
    instance_local = VarTo<Js::RecyclableObject>(instance_00);
  }
  return instance_local;
}

Assistant:

RecyclableObject* JavascriptOperators::GetIterator(RecyclableObject* instance, ScriptContext * scriptContext, bool optional)
    {
        RecyclableObject* function = GetIteratorFunction(instance, scriptContext, optional);

        if (function == nullptr)
        {
            Assert(optional);
            return nullptr;
        }

        Var iterator = scriptContext->GetThreadContext()->ExecuteImplicitCall(function, Js::ImplicitCall_Accessor, [=]()->Js::Var
        {
            return CALL_FUNCTION(scriptContext->GetThreadContext(), function, CallInfo(Js::CallFlags_Value, 1), instance);
        });

        if (!JavascriptOperators::IsObject(iterator))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedObject);
        }

        return VarTo<RecyclableObject>(iterator);
    }